

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared-c.cpp
# Opt level: O1

idx_t duckdb_extract_statements
                (duckdb_connection connection,char *query,
                duckdb_extracted_statements *out_extracted_statements)

{
  duckdb_extracted_statements p_Var1;
  size_t sVar2;
  idx_t iVar3;
  ErrorData error;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_e8;
  string local_c8 [4];
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_48;
  
  if (out_extracted_statements == (duckdb_extracted_statements *)0x0 ||
      (query == (char *)0x0 || connection == (duckdb_connection)0x0)) {
    iVar3 = 0;
  }
  else {
    p_Var1 = (duckdb_extracted_statements)operator_new(0x38);
    *(long *)(p_Var1 + 0x10) = 0;
    *(long *)(p_Var1 + 0x18) = 0;
    *(long *)(p_Var1 + 0x20) = 0;
    *(long *)(p_Var1 + 0x28) = 0;
    *(long *)p_Var1 = 0;
    *(long *)(p_Var1 + 8) = 0;
    *(long *)(p_Var1 + 0x30) = 0;
    *(duckdb_extracted_statements *)(p_Var1 + 0x18) = p_Var1 + 0x28;
    *(long *)(p_Var1 + 0x20) = 0;
    p_Var1[0x28] = (_duckdb_extracted_statements)0x0;
    local_c8[0]._M_dataplus._M_p = (pointer)&local_c8[0].field_2;
    sVar2 = strlen(query);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,query,query + sVar2);
    duckdb::Connection::ExtractStatements
              ((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                *)&local_e8,(Connection *)connection,local_c8);
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = *(pointer *)p_Var1;
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(p_Var1 + 8);
    local_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(p_Var1 + 0x10);
    *(pointer *)p_Var1 =
         local_e8.
         super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(p_Var1 + 8) =
         local_e8.
         super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(p_Var1 + 0x10) =
         local_e8.
         super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ::~vector(&local_48);
    std::
    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
    ::~vector(&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8[0]._M_dataplus._M_p != &local_c8[0].field_2) {
      operator_delete(local_c8[0]._M_dataplus._M_p);
    }
    *out_extracted_statements = p_Var1;
    iVar3 = *(long *)(p_Var1 + 8) - *(long *)p_Var1 >> 3;
  }
  return iVar3;
}

Assistant:

idx_t duckdb_extract_statements(duckdb_connection connection, const char *query,
                                duckdb_extracted_statements *out_extracted_statements) {
	if (!connection || !query || !out_extracted_statements) {
		return 0;
	}
	auto wrapper = new ExtractStatementsWrapper();
	Connection *conn = reinterpret_cast<Connection *>(connection);
	try {
		wrapper->statements = conn->ExtractStatements(query);
	} catch (const std::exception &ex) {
		ErrorData error(ex);
		wrapper->error = error.Message();
	}

	*out_extracted_statements = (duckdb_extracted_statements)wrapper;
	return wrapper->statements.size();
}